

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O0

size_type fs_strncpy(char *path,char *result,size_type buffer_size)

{
  error_code eVar1;
  error_code local_60;
  string_view local_50;
  string_view local_40;
  char *local_30;
  size_type L;
  size_type buffer_size_local;
  char *result_local;
  char *path_local;
  
  L = buffer_size;
  buffer_size_local = (size_type)result;
  result_local = path;
  local_30 = (char *)strlen(path);
  if (local_30 < L) {
    if (local_30 != (char *)0x0) {
      strncpy((char *)buffer_size_local,result_local,L);
    }
    path_local = local_30;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,result_local)
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"fs_strncpy")
    ;
    eVar1 = std::make_error_code(result_out_of_range);
    local_60._M_cat = eVar1._M_cat;
    local_60._M_value = eVar1._M_value;
    fs_print_error(local_40,local_50,&local_60);
    path_local = (char *)0x0;
  }
  return (size_type)path_local;
}

Assistant:

std::string::size_type fs_strncpy(const char* path, char* result, const std::string::size_type buffer_size)
{
// check size before copy
  std::string::size_type L = std::strlen(path);
  if(L >= buffer_size){
    fs_print_error(path, __func__, std::make_error_code(std::errc::result_out_of_range));
    return 0;
  }

  if(L)
    #ifdef _MSC_VER
      strncpy_s(result, buffer_size, path, _TRUNCATE);
    #else
      std::strncpy(result, path, buffer_size);
    #endif

  return L;
}